

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O2

fio_str_info_s * fiobj_data_read2ch(fio_str_info_s *__return_storage_ptr__,FIOBJ io,uint8_t token)

{
  long lVar1;
  undefined8 uVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  ssize_t sVar6;
  int *piVar7;
  char *pcVar8;
  char *pcVar9;
  uint8_t *pos;
  uint8_t *local_30;
  
  if ((io == 0) || (sVar4 = fiobj_type_is(io,(fiobj_type_enum)io), sVar4 == 0)) {
    piVar7 = __errno_location();
    *piVar7 = 0xe;
  }
  else if (*(int *)(io + 0x30) == -2) {
    if (*(long *)(io + 0x28) != *(long *)(io + 0x20)) {
      uVar2 = *(undefined8 *)(*(long *)(io + 0x10) + 0x28);
      *(long *)(*(long *)(io + 0x10) + 0x28) = *(long *)(io + 0x28) + *(long *)(io + 0x18);
      fiobj_data_read2ch(__return_storage_ptr__,*(FIOBJ *)(io + 0x10),token);
      *(undefined8 *)(*(long *)(io + 0x10) + 0x28) = uVar2;
      uVar5 = *(ulong *)(io + 0x20);
      if (__return_storage_ptr__->len + *(long *)(io + 0x28) <= uVar5) {
        return __return_storage_ptr__;
      }
      __return_storage_ptr__->len = uVar5 - *(long *)(io + 0x28);
LAB_0013a15b:
      *(ulong *)(io + 0x28) = uVar5;
      return __return_storage_ptr__;
    }
  }
  else if (*(int *)(io + 0x30) == -1) {
    if (*(long *)(io + 0x28) != *(long *)(io + 0x20)) {
      local_30 = (uint8_t *)(*(long *)(io + 0x28) + *(long *)(io + 8));
      swallow_ch(&local_30,(uint8_t *)(*(long *)(io + 0x20) + *(long *)(io + 8)),token);
      __return_storage_ptr__->capa = 0;
      lVar1 = *(long *)(io + 8);
      pcVar8 = (char *)(*(long *)(io + 0x28) + lVar1);
      __return_storage_ptr__->len = (long)local_30 - (long)pcVar8;
      __return_storage_ptr__->data = pcVar8;
      uVar5 = (long)local_30 - lVar1;
      goto LAB_0013a15b;
    }
  }
  else {
    local_30 = (uint8_t *)(*(long *)(io + 8) + *(long *)(io + 0x28));
    if ((*(long *)(io + 0x28) != *(long *)(io + 0x20)) &&
       (iVar3 = swallow_ch(&local_30,(uint8_t *)(*(long *)(io + 8) + *(long *)(io + 0x20)),token),
       iVar3 != 0)) {
      pcVar9 = (char *)(*(long *)(io + 8) + *(long *)(io + 0x28));
      sVar4 = (long)local_30 - (long)pcVar9;
      *(size_t *)(io + 0x28) = sVar4 + *(long *)(io + 0x28);
      pcVar8 = (char *)0x0;
      if (sVar4 != 0) {
        pcVar8 = pcVar9;
      }
      *(long *)(io + 0x10) = *(long *)(io + 0x10) + sVar4;
      __return_storage_ptr__->len = sVar4;
      __return_storage_ptr__->capa = 0;
      __return_storage_ptr__->data = pcVar8;
      return __return_storage_ptr__;
    }
    *(size_t *)(io + 0x20) = 0;
    *(undefined8 *)(io + 0x28) = 0;
    while( true ) {
      fiobj_data_pre_write(io,0x1000);
      while( true ) {
        sVar6 = pread(*(int *)(io + 0x30),(void *)(*(long *)(io + 8) + *(long *)(io + 0x20)),0x1000,
                      *(long *)(io + 0x20) + *(long *)(io + 0x10));
        if (-1 < sVar6) break;
        piVar7 = __errno_location();
        if (*piVar7 != 4) goto LAB_0013a0f0;
      }
      sVar4 = *(size_t *)(io + 0x20);
      if (sVar6 == 0) break;
      *(size_t *)(io + 0x20) = sVar4 + sVar6;
      local_30 = *(uint8_t **)(io + 8);
      iVar3 = swallow_ch(&local_30,local_30 + sVar4 + sVar6,token);
      if (iVar3 != 0) {
        pcVar8 = *(char **)(io + 8);
        sVar4 = (long)local_30 - (long)(pcVar8 + *(long *)(io + 0x28));
        *(size_t *)(io + 0x28) = sVar4;
        *(long *)(io + 0x10) = *(long *)(io + 0x10) + sVar4;
        __return_storage_ptr__->capa = 0;
        __return_storage_ptr__->len = sVar4;
        __return_storage_ptr__->data = pcVar8;
        return __return_storage_ptr__;
      }
    }
    if (sVar4 != 0) {
      *(long *)(io + 0x10) = *(long *)(io + 0x10) + sVar4;
      __return_storage_ptr__->capa = 0;
      __return_storage_ptr__->len = sVar4;
      __return_storage_ptr__->data = *(char **)(io + 8);
      return __return_storage_ptr__;
    }
  }
LAB_0013a0f0:
  __return_storage_ptr__->capa = 0;
  __return_storage_ptr__->len = 0;
  __return_storage_ptr__->data = (char *)0x0;
  return __return_storage_ptr__;
}

Assistant:

fio_str_info_s fiobj_data_read2ch(FIOBJ io, uint8_t token) {
  if (!io || !FIOBJ_TYPE_IS(io, FIOBJ_T_DATA)) {
    errno = EFAULT;
    return (fio_str_info_s){.data = NULL, .len = 0};
  }
  switch (obj2io(io)->fd) {
  case -1:
    return fiobj_data_read2ch_str(io, token);
    break;
  case -2:
    return fiobj_data_read2ch_slice(io, token);
    break;
  default:
    return fiobj_data_read2ch_file(io, token);
  }
}